

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxRuntime.cpp
# Opt level: O2

void __thiscall Jinx::Impl::Runtime::~Runtime(Runtime *this)

{
  _Rb_tree_node_base *p_Var1;
  _Base_ptr p_Var2;
  _Rb_tree_node_base *p_Var3;
  CollectionPtr c;
  long local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  for (p_Var2 = (this->m_propertyMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->m_propertyMap)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    if (*(int *)&p_Var2[1]._M_parent == 5) {
      Jinx::Variant::GetCollection((Variant *)&local_40);
      p_Var3 = (_Rb_tree_node_base *)(local_40 + 8);
      for (p_Var1 = *(_Rb_tree_node_base **)(local_40 + 0x18); p_Var1 != p_Var3;
          p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
        Jinx::Variant::SetNull((Variant *)&p_Var1[2]._M_parent);
      }
      Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
    }
  }
  std::
  _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_Jinx::Impl::SymbolType>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_Jinx::Impl::SymbolType>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_Jinx::StaticAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_Jinx::Impl::SymbolType>,_4096UL,_16UL>_>
  ::~_Rb_tree(&(this->m_symbolTypeMap)._M_t);
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_Jinx::Variant>,_std::_Select1st<std::pair<const_unsigned_long,_Jinx::Variant>_>,_std::less<unsigned_long>,_Jinx::StaticAllocator<std::pair<const_unsigned_long,_Jinx::Variant>,_4096UL,_16UL>_>
  ::~_Rb_tree(&(this->m_propertyMap)._M_t);
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<Jinx::Impl::FunctionDefinition>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::shared_ptr<Jinx::Impl::FunctionDefinition>_>_>,_std::less<unsigned_long>,_Jinx::StaticAllocator<std::pair<const_unsigned_long,_std::shared_ptr<Jinx::Impl::FunctionDefinition>_>,_4096UL,_16UL>_>
  ::~_Rb_tree(&(this->m_functionMap)._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::shared_ptr<Jinx::Impl::Library>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::shared_ptr<Jinx::Impl::Library>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_Jinx::StaticAllocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::shared_ptr<Jinx::Impl::Library>_>,_4096UL,_16UL>_>
  ::~_Rb_tree(&(this->m_libraryMap)._M_t);
  (this->m_staticArena).m_ptr = (char *)0x0;
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            (&(this->super_enable_shared_from_this<Jinx::Impl::Runtime>)._M_weak_this.
              super___weak_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

inline_t Runtime::~Runtime()
	{
		// Clear potential circular references by explicitly destroying collection values
		for (auto & s : m_propertyMap)
		{
			if (s.second.IsCollection())
			{
				auto c = s.second.GetCollection();
				for (auto & e : *c)
				{
					e.second.SetNull();
				}
			}
		}
	}